

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::Restaurant(Restaurant *this,Restaurant *other)

{
  pointer ppTVar1;
  Table *other_00;
  pointer ppBVar2;
  int iVar3;
  Table *this_00;
  undefined4 extraout_var;
  pointer ppTVar4;
  pointer ppBVar5;
  Table *tempTable;
  string *local_48;
  vector<Table_*,_std::allocator<Table_*>_> *local_40;
  Restaurant *local_38;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_0010fd88;
  this->open = other->open;
  this->nextCustomerId = other->nextCustomerId;
  local_40 = &this->tables;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Dish,_std::allocator<Dish>_>::vector(&this->menu,&other->menu);
  local_48 = &this->newMsg;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_48,"",(allocator *)&tempTable);
  ppTVar1 = (other->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = other;
  for (ppTVar4 = (other->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1) {
    other_00 = *ppTVar4;
    this_00 = (Table *)operator_new(0x40);
    Table::Table(this_00,other_00);
    tempTable = this_00;
    std::vector<Table_*,_std::allocator<Table_*>_>::push_back(local_40,&tempTable);
  }
  ppBVar2 = (local_38->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (local_38->actionsLog).
                 super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppBVar5 != ppBVar2; ppBVar5 = ppBVar5 + 1) {
    iVar3 = (*(*ppBVar5)->_vptr_BaseAction[2])();
    tempTable = (Table *)CONCAT44(extraout_var,iVar3);
    std::vector<BaseAction*,std::allocator<BaseAction*>>::emplace_back<BaseAction*>
              ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,
               (BaseAction **)&tempTable);
  }
  return;
}

Assistant:

Restaurant::Restaurant(const Restaurant &other) :open(other.open), nextCustomerId(other.nextCustomerId),  tables(), menu(other.menu), actionsLog(), newMsg("")
{
    for (auto table : other.tables) {
        auto * tempTable = new Table(*table);
        tables.push_back(tempTable);
    }
    for (auto j : other.actionsLog) {
        actionsLog.push_back(j->clone());
    }
}